

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_512f7::DiskInterfaceTestMakeDirs::Run(DiskInterfaceTestMakeDirs *this)

{
  Test *pTVar1;
  bool condition;
  int iVar2;
  char *__filename;
  FILE *pFVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  FILE *local_50;
  FILE *f;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string path;
  DiskInterfaceTestMakeDirs *this_local;
  
  path.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"path/with/double//slash/",&local_31);
  std::allocator<char>::~allocator(&local_31);
  pTVar1 = g_current_test;
  condition = DiskInterface::MakeDirs
                        (&(this->super_DiskInterfaceTest).disk_.super_DiskInterface,
                         (string *)local_30);
  testing::Test::Check
            (pTVar1,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
             ,0xc3,"disk_.MakeDirs(path)");
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 "a_file");
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar3 = fopen(__filename,"w");
  std::__cxx11::string::~string((string *)&local_70);
  local_50 = pFVar3;
  testing::Test::Check
            (g_current_test,pFVar3 != (FILE *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
             ,0xc5,"f");
  pTVar1 = g_current_test;
  iVar2 = fclose(local_50);
  testing::Test::Check
            (pTVar1,iVar2 == 0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
             ,0xc6,"0 == fclose(f)");
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, MakeDirs) {
  string path = "path/with/double//slash/";
  EXPECT_TRUE(disk_.MakeDirs(path));
  FILE* f = fopen((path + "a_file").c_str(), "w");
  EXPECT_TRUE(f);
  EXPECT_EQ(0, fclose(f));
#ifdef _WIN32
  string path2 = "another\\with\\back\\\\slashes\\";
  EXPECT_TRUE(disk_.MakeDirs(path2.c_str()));
  FILE* f2 = fopen((path2 + "a_file").c_str(), "w");
  EXPECT_TRUE(f2);
  EXPECT_EQ(0, fclose(f2));
#endif
}